

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<signed_char> *this;
  ImSpan<ImGuiTableColumn> *this_00;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  byte bVar6;
  undefined2 uVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  ImU32 id;
  ulong uVar15;
  char *pcVar16;
  ImGuiTableColumn *pIVar17;
  ImGuiTableColumn *pIVar18;
  byte *pbVar19;
  short sVar20;
  int iVar21;
  int order_n_1;
  int order_n;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_cc;
  float local_c8;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar9 = GImGui;
  if (table->IsLayoutLocked != false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x20ca,"TableUpdateLayout","ImGui ASSERT FAILED: %s",
                "table->IsLayoutLocked == false");
  }
  pIVar10 = GImGui;
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar28 = table->CellPaddingX2;
  fVar1 = (table->WorkRect).Min.x;
  fVar2 = (table->WorkRect).Min.y;
  fVar31 = (table->WorkRect).Max.x;
  fVar27 = (pIVar10->Style).FramePadding.x;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  table->ColumnsAutoFitWidth = 0.0;
  fVar27 = fVar27 * 3.0;
  this = &table->DisplayOrderToIndex;
  this_00 = &table->Columns;
  local_c8 = 0.0;
  local_cc = 0.0;
  for (uVar22 = 0; uVar15 = (ulong)table->ColumnsCount, (long)uVar22 < (long)uVar15;
      uVar22 = uVar22 + 1) {
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) != 0) {
      pcVar16 = ImSpan<signed_char>::operator[](this,(int)uVar22);
      cVar5 = *pcVar16;
      pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)cVar5);
      uVar13 = TableFixColumnFlags(table,pIVar17->FlagsIn);
      uVar23 = (uint)(cVar5 != '\0') * 0x4000 + 0x4000;
      if ((uVar13 & 0xc000) != 0) {
        uVar23 = 0;
      }
      uVar23 = uVar23 | uVar13;
      pIVar17->Flags = uVar23;
      uVar13 = table->Flags;
      if ((uVar13 & 8) != 0) {
        TableFixColumnSortDirection(pIVar17);
        uVar13 = table->Flags;
        uVar23 = pIVar17->Flags;
      }
      uVar7 = pIVar17->ContentWidthRowsFrozen;
      sVar20 = pIVar17->ContentWidthRowsUnfrozen;
      if (pIVar17->ContentWidthRowsUnfrozen < (short)uVar7) {
        sVar20 = uVar7;
      }
      fVar29 = (float)(int)sVar20;
      if ((uVar23 & 0x800) == 0 && (uVar13 & 0x20000) == 0) {
        uVar26 = -(uint)((float)(int)pIVar17->ContentWidthHeadersIdeal <= fVar29);
        fVar29 = (float)((uint)fVar29 & uVar26 |
                        ~uVar26 & (uint)(float)(int)pIVar17->ContentWidthHeadersIdeal);
      }
      fVar29 = fVar29 + fVar28;
      uVar26 = -(uint)(fVar27 <= fVar29);
      fVar29 = (float)(~uVar26 & (uint)fVar27 | (uint)fVar29 & uVar26);
      if ((((uVar23 & 4) != 0) && (fVar30 = pIVar17->WidthOrWeightInitValue, 0.0 < fVar30)) &&
         (((uVar13 & 1) == 0 || ((uVar23 & 0x20) == 0)))) {
        fVar29 = (float)(~-(uint)(fVar30 <= fVar29) & (uint)fVar30 |
                        -(uint)(fVar30 <= fVar29) & (uint)fVar29);
      }
      fVar30 = table->ColumnsAutoFitWidth + fVar29;
      table->ColumnsAutoFitWidth = fVar30;
      if (pIVar17->PrevVisibleColumn != -1) {
        table->ColumnsAutoFitWidth = fVar30 + table->CellSpacingX;
      }
      if ((uVar23 & 0x14) == 0) {
        if ((uVar23 & 8) == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x2115,"TableUpdateLayout","ImGui ASSERT FAILED: %s",
                      "column->Flags & ImGuiTableColumnFlags_WidthStretch");
        }
        fVar29 = pIVar17->WidthStretchWeight;
        if (fVar29 < 0.0) {
          pIVar17->WidthStretchWeight = 1.0;
          fVar29 = 1.0;
        }
        local_cc = local_cc + fVar29;
        if (table->LeftMostStretchedColumnDisplayOrder == -1) {
          table->LeftMostStretchedColumnDisplayOrder = pIVar17->DisplayOrder;
        }
      }
      else {
        if ((char)((uVar23 & 0x10) >> 4) == '\0' && pIVar17->AutoFitQueue == '\0') {
          fVar29 = pIVar17->WidthRequest;
        }
        else {
          pIVar17->WidthRequest = fVar29;
          if (('\x01' < pIVar17->AutoFitQueue) && (table->IsInitializing == true)) {
            uVar23 = -(uint)(fVar27 * 4.0 <= fVar29);
            fVar29 = (float)((uint)fVar29 & uVar23 | ~uVar23 & (uint)(fVar27 * 4.0));
            pIVar17->WidthRequest = fVar29;
          }
        }
        local_c8 = local_c8 + fVar29;
      }
    }
  }
  fVar28 = (float)(table->ColumnsVisibleCount + -1) * table->CellSpacingX;
  if ((((table->Flags & 0x100000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth)))
  {
    fVar31 = fVar31 - fVar1;
  }
  else {
    fVar31 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar31 = (fVar31 - fVar28) - local_c8;
  table->ColumnsTotalWidth = fVar28;
  iVar21 = 0;
  local_c8 = fVar31;
  for (uVar22 = 0; (long)uVar22 < (long)(int)uVar15; uVar22 = uVar22 + 1) {
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) != 0) {
      pcVar16 = ImSpan<signed_char>::operator[](this,(int)uVar22);
      pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar16);
      if ((pIVar17->Flags & 8) != 0) {
        fVar28 = (pIVar17->WidthStretchWeight / local_cc) * fVar31;
        uVar23 = -(uint)(fVar27 <= fVar28);
        fVar28 = (float)(int)((float)(~uVar23 & (uint)fVar27 | (uint)fVar28 & uVar23) + 0.01);
        pIVar17->WidthRequest = fVar28;
        local_c8 = local_c8 - fVar28;
        if (pIVar17->NextVisibleColumn != -1) {
          pIVar18 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)pIVar17->NextVisibleColumn);
          if ((pIVar18->Flags & 4U) != 0) {
            pIVar17->Flags = pIVar17->Flags | pIVar18->Flags & 0x100000U;
          }
        }
      }
      if (pIVar17->NextVisibleColumn == -1) {
        uVar23 = pIVar17->Flags;
        if (table->LeftMostStretchedColumnDisplayOrder != -1) {
          uVar23 = uVar23 | 0x100000;
          pIVar17->Flags = uVar23;
        }
      }
      else {
        uVar23 = pIVar17->Flags;
      }
      iVar21 = iVar21 + (uint)((uVar23 & 0x20) == 0);
      uVar23 = -(uint)(fVar27 <= pIVar17->WidthRequest);
      fVar28 = (float)(int)(float)(~uVar23 & (uint)fVar27 | (uint)pIVar17->WidthRequest & uVar23);
      pIVar17->WidthGiven = fVar28;
      table->ColumnsTotalWidth = fVar28 + table->ColumnsTotalWidth;
      uVar15 = (ulong)(uint)table->ColumnsCount;
    }
  }
  if ((1.0 <= local_c8) && (0.0 < local_cc)) {
    uVar15 = uVar15 & 0xffffffff;
    do {
      uVar22 = uVar15 & 0xffffffff;
      do {
        do {
          uVar15 = uVar15 - 1;
          if ((local_c8 < 1.0) || ((int)uVar22 < 1)) goto LAB_001c622c;
          uVar23 = (int)uVar22 - 1;
          uVar22 = (ulong)uVar23;
        } while ((table->VisibleMaskByDisplayOrder >> (uVar15 & 0x3f) & 1) == 0);
        pcVar16 = ImSpan<signed_char>::operator[](this,uVar23);
        pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)*pcVar16);
      } while ((pIVar17->Flags & 8) == 0);
      uVar3 = pIVar17->WidthRequest;
      uVar4 = pIVar17->WidthGiven;
      pIVar17->WidthRequest = (float)uVar3 + 1.0;
      pIVar17->WidthGiven = (float)uVar4 + 1.0;
      local_c8 = local_c8 + -1.0;
    } while( true );
  }
LAB_001c622c:
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar28 = (table->OuterRect).Max.y;
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  fVar31 = local_40.Min.y + table->LastOuterHeight;
  uVar23 = -(uint)(fVar31 <= fVar28);
  local_40.Max.y = (float)(uVar23 & (uint)fVar28 | ~uVar23 & (uint)fVar31);
  iVar25 = 0;
  bVar11 = ItemHoverable(&local_40,0);
  fVar28 = fVar1;
  if ('\0' < table->FreezeColumnsCount) {
    fVar28 = (table->OuterRect).Min.x;
  }
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  uVar22 = 0;
  iVar24 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar22) {
      if ((bVar11) && (table->HoveredColumnBody == -1)) {
        fVar28 = (table->WorkRect).Min.x;
        if (table->RightMostVisibleColumn != -1) {
          pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)table->RightMostVisibleColumn)
          ;
          fVar1 = (pIVar17->ClipRect).Max.x;
          uVar23 = -(uint)(fVar1 <= fVar28);
          fVar28 = (float)(uVar23 & (uint)fVar28 | ~uVar23 & (uint)fVar1);
        }
        if (fVar28 <= (pIVar9->IO).MousePos.x) {
          table->HoveredColumnBody = (ImS8)table->ColumnsCount;
        }
      }
      if ((iVar21 == 0) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      TableUpdateDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar11 = BeginPopupEx(id,0x141);
        if (bVar11) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      pIVar8 = table->InnerWindow;
      if ((table->Flags & 0x4000) == 0) {
        ImDrawList::PushClipRect
                  (pIVar8->DrawList,(pIVar8->ClipRect).Min,(pIVar8->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar8->DrawList,1);
      }
      if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
        TableSortSpecsBuild(table);
      }
      return;
    }
    pbVar19 = (byte *)ImSpan<signed_char>::operator[](this,(int)uVar22);
    bVar6 = *pbVar19;
    pIVar17 = ImSpan<ImGuiTableColumn>::operator[](this_00,(int)(char)bVar6);
    if (iVar24 == table->FreezeColumnsCount && '\0' < table->FreezeColumnsCount) {
      fVar28 = fVar28 + (fVar1 - (table->OuterRect).Min.x);
    }
    if ((table->VisibleMaskByDisplayOrder >> (uVar22 & 0x3f) & 1) == 0) {
      pIVar17->MaxX = fVar28;
      pIVar17->MinX = fVar28;
      pIVar17->StartXHeaders = fVar28;
      pIVar17->StartXRows = fVar28;
      pIVar17->WidthGiven = 0.0;
      (pIVar17->ClipRect).Min.x = fVar28;
      (pIVar17->ClipRect).Min.y = fVar2;
      (pIVar17->ClipRect).Max.x = fVar28;
      (pIVar17->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar17->ClipRect,&host_clip_rect);
      pIVar17->IsClipped = true;
      pIVar17->SkipItems = true;
    }
    else {
      if (((uint)table->Flags >> 0x14 & 1) == 0) {
        fVar31 = 3.4028235e+38;
        if (((uint)table->Flags >> 0x13 & 1) == 0) {
          iVar14 = ~(int)pIVar17->IndexWithinVisibleSet + table->ColumnsVisibleCount;
          fVar31 = (table->WorkRect).Max.x;
LAB_001c63f9:
          fVar31 = fVar31 - (float)iVar14 * fVar27;
        }
      }
      else {
        fVar31 = 3.4028235e+38;
        if ((long)uVar22 < (long)table->FreezeColumnsRequest) {
          iVar14 = table->FreezeColumnsRequest + iVar25;
          fVar31 = (table->InnerClipRect).Max.x;
          goto LAB_001c63f9;
        }
      }
      fVar29 = pIVar17->WidthGiven + fVar28;
      if (fVar31 < fVar29) {
        uVar23 = -(uint)(fVar27 <= fVar31 - fVar28);
        fVar29 = (float)(~uVar23 & (uint)fVar27 | (uint)(fVar31 - fVar28) & uVar23);
        pIVar17->WidthGiven = fVar29;
        fVar29 = fVar29 + fVar28;
      }
      pIVar17->MinX = fVar28;
      pIVar17->MaxX = fVar29;
      (pIVar17->ClipRect).Min.x = fVar28;
      (pIVar17->ClipRect).Min.y = fVar2;
      (pIVar17->ClipRect).Max.x = fVar29;
      (pIVar17->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar17->ClipRect,&host_clip_rect);
      fVar31 = (pIVar17->ClipRect).Min.x;
      if ((fVar31 < (pIVar17->ClipRect).Max.x) || ((pIVar17->AutoFitQueue & 1U) != 0)) {
        pIVar17->IsClipped = false;
      }
      else {
        pIVar17->IsClipped = (bool)(~pIVar17->CannotSkipItemsQueue & 1);
        if ((pIVar17->CannotSkipItemsQueue & 1U) == 0) {
          table->VisibleUnclippedMaskByIndex =
               table->VisibleUnclippedMaskByIndex &
               (-2L << (bVar6 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar6 & 0x3f));
        }
      }
      bVar12 = true;
      if (pIVar17->IsVisible == true) {
        bVar12 = table->HostSkipItems;
      }
      pIVar17->SkipItems = bVar12;
      if (((bVar11) && (fVar29 = (pIVar9->IO).MousePos.x, fVar31 <= fVar29)) &&
         (fVar29 < (pIVar17->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar6;
      }
      fVar31 = pIVar17->MinX + table->CellPaddingX1;
      pIVar17->StartXRows = fVar31;
      pIVar17->StartXHeaders = fVar31;
      pIVar17->ContentMaxPosRowsFrozen = fVar31;
      pIVar17->ContentMaxPosRowsUnfrozen = fVar31;
      pIVar17->ContentMaxPosHeadersIdeal = fVar31;
      pIVar17->ContentMaxPosHeadersUsed = fVar31;
      if (table->HostSkipItems == false) {
        pIVar17->AutoFitQueue = pIVar17->AutoFitQueue >> 1;
        pIVar17->CannotSkipItemsQueue = pIVar17->CannotSkipItemsQueue >> 1;
      }
      if (iVar24 < table->FreezeColumnsCount) {
        fVar31 = pIVar17->MaxX + 2.0;
        uVar23 = -(uint)(fVar31 <= host_clip_rect.Min.x);
        host_clip_rect.Min.x = (float)(~uVar23 & (uint)fVar31 | (uint)host_clip_rect.Min.x & uVar23)
        ;
      }
      fVar28 = fVar28 + pIVar17->WidthGiven + table->CellSpacingX;
      iVar24 = iVar24 + 1;
    }
    uVar22 = uVar22 + 1;
    iVar25 = iVar25 + -1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float min_column_width = TableGetMinColumnWidth();

//    int count_fixed = 0;  -- set but never used
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);

        // Non-resizable columns also submit their requested width
        if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
            if (column->WidthOrWeightInitValue > 0.0f)
                if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                    column_width_ideal = ImMax(column_width_ideal, column->WidthOrWeightInitValue);

        // CellSpacingX is >0.0f when there's no vertical border
        table->ColumnsAutoFitWidth += column_width_ideal;
        if (column->PrevVisibleColumn != -1)
            table->ColumnsAutoFitWidth += table->CellSpacingX;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
//            count_fixed += 1;   -- set but never used
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}